

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTrans.c
# Opt level: O2

void Saig_ManSetMap2(Aig_Man_t *p,Aig_Obj_t *pOld,int f1,Aig_Obj_t *pNew,int f2)

{
  Vec_Int_t *p_00;
  uint __line;
  char *__assertion;
  int iVar1;
  
  if (((ulong)pOld & 1) == 0) {
    if (((ulong)pNew & 1) == 0) {
      p_00 = (Vec_Int_t *)p->pData2;
      iVar1 = f1 * p->vObjs->nSize + pOld->Id;
      Vec_IntWriteEntry(p_00,iVar1 * 2,pNew->Id);
      Vec_IntWriteEntry(p_00,iVar1 * 2 + 1,f2);
      return;
    }
    __assertion = "!Aig_IsComplement(pNew)";
    __line = 0x7d;
  }
  else {
    __assertion = "!Aig_IsComplement(pOld)";
    __line = 0x7c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigTrans.c"
                ,__line,"void Saig_ManSetMap2(Aig_Man_t *, Aig_Obj_t *, int, Aig_Obj_t *, int)");
}

Assistant:

static inline void Saig_ManSetMap2( Aig_Man_t * p, Aig_Obj_t * pOld, int f1, Aig_Obj_t * pNew, int f2 ) 
{
    Vec_Int_t * vMap = (Vec_Int_t *)p->pData2;
    int nOffset = f1 * Aig_ManObjNumMax(p) + pOld->Id;
    assert( !Aig_IsComplement(pOld) );
    assert( !Aig_IsComplement(pNew) );
    Vec_IntWriteEntry( vMap, 2*nOffset + 0, pNew->Id );
    Vec_IntWriteEntry( vMap, 2*nOffset + 1, f2 );
}